

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_scandir_empty_dir(void)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uint uVar3;
  int extraout_EAX_03;
  int iVar4;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_loop_t *puVar5;
  uv_loop_t *extraout_RAX;
  uv_loop_t *puVar6;
  __off64_t _Var7;
  uv_buf_t *bufs;
  char *pcVar8;
  uv_fs_t *puVar9;
  uv_fs_t *req_00;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uv_buf_t uVar15;
  uv_dirent_t dent;
  uv_fs_t req;
  char acStack_a62 [2];
  uv_loop_t *puStack_a60;
  uv_buf_t uStack_9c8;
  uv_buf_t uStack_9b8;
  uv_loop_t *puStack_9a0;
  uv_fs_t *puStack_998;
  uv_fs_t *puStack_990;
  uv_buf_t uStack_958;
  uv_buf_t uStack_948;
  uv_buf_t uStack_938;
  uv_buf_t uStack_928;
  char acStack_918 [256];
  char acStack_818 [256];
  char acStack_718 [128];
  char acStack_698 [136];
  uv_loop_t *puStack_610;
  uv_fs_t *puStack_608;
  uv_loop_t *puStack_600;
  uv_fs_t uStack_5b8;
  uv_loop_t *puStack_400;
  uv_fs_t *puStack_3f8;
  code *pcStack_3f0;
  uv_loop_t *puStack_3e8;
  undefined1 auStack_3d8 [8];
  undefined8 uStack_3d0;
  uv_dirent_t uStack_3c8;
  undefined1 auStack_3b8 [496];
  void *local_170;
  void *local_168;
  
  auStack_3b8._472_8_ = (void *)0x154699;
  loop = uv_default_loop();
  pcVar8 = "./empty_dir/";
  auStack_3b8._472_8_ = (void *)0x1546c1;
  uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"./empty_dir/",0x1ff,
              (uv_fs_cb)0x0);
  auStack_3b8._472_8_ = (void *)0x1546c9;
  uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
  auStack_3b8._472_8_ = (void *)0x1546db;
  memset((uv_fs_t *)&stack0xfffffffffffffe38,0xdb,0x1b8);
  puVar5 = (uv_loop_t *)0x0;
  auStack_3b8._472_8_ = (void *)0x1546ed;
  iVar2 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"./empty_dir/",0,
                        (uv_fs_cb)0x0);
  if (iVar2 == 0) {
    if (local_170 != (void *)0x0) goto LAB_001547e4;
    if (local_168 != (void *)0x0) goto LAB_001547e9;
    puVar5 = (uv_loop_t *)&stack0xfffffffffffffe38;
    auStack_3b8._472_8_ = (void *)0x15471a;
    iVar2 = uv_fs_scandir_next((uv_fs_t *)puVar5,(uv_dirent_t *)(auStack_3b8 + 0x1e0));
    if (iVar2 != -0xfff) goto LAB_001547ee;
    auStack_3b8._472_8_ = (void *)0x15472f;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    auStack_3b8._472_8_ = (void *)0x154752;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./empty_dir/",0,empty_scandir_cb);
    if (iVar2 != 0) goto LAB_001547f3;
    if (scandir_cb_count != 0) goto LAB_001547f8;
    auStack_3b8._472_8_ = (void *)0x154775;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_001547fd;
    auStack_3b8._472_8_ = (void *)0x154796;
    uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe38,"./empty_dir/",(uv_fs_cb)0x0);
    auStack_3b8._472_8_ = (void *)0x15479e;
    uv_fs_req_cleanup((uv_fs_t *)&stack0xfffffffffffffe38);
    auStack_3b8._472_8_ = (void *)0x1547a3;
    pcVar8 = (char *)uv_default_loop();
    auStack_3b8._472_8_ = (void *)0x1547b7;
    uv_walk((uv_loop_t *)pcVar8,close_walk_cb,(void *)0x0);
    auStack_3b8._472_8_ = (void *)0x1547c1;
    uv_run((uv_loop_t *)pcVar8,UV_RUN_DEFAULT);
    auStack_3b8._472_8_ = (void *)0x1547c6;
    puVar5 = uv_default_loop();
    auStack_3b8._472_8_ = (void *)0x1547ce;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    auStack_3b8._472_8_ = (void *)0x1547e4;
    run_test_fs_scandir_empty_dir_cold_1();
LAB_001547e4:
    auStack_3b8._472_8_ = (void *)0x1547e9;
    run_test_fs_scandir_empty_dir_cold_2();
LAB_001547e9:
    auStack_3b8._472_8_ = (void *)0x1547ee;
    run_test_fs_scandir_empty_dir_cold_3();
LAB_001547ee:
    auStack_3b8._472_8_ = (void *)0x1547f3;
    run_test_fs_scandir_empty_dir_cold_4();
LAB_001547f3:
    auStack_3b8._472_8_ = (void *)0x1547f8;
    run_test_fs_scandir_empty_dir_cold_5();
LAB_001547f8:
    auStack_3b8._472_8_ = (void *)0x1547fd;
    run_test_fs_scandir_empty_dir_cold_6();
LAB_001547fd:
    auStack_3b8._472_8_ = (void *)0x154802;
    run_test_fs_scandir_empty_dir_cold_7();
  }
  auStack_3b8._472_8_ = empty_scandir_cb;
  run_test_fs_scandir_empty_dir_cold_8();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00154868;
    if (scandir_req.result != 0) goto LAB_0015486d;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00154872;
    auStack_3b8._448_8_ = (_func_void *)0x154845;
    iVar2 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)(auStack_3b8 + 0x1d0));
    if (iVar2 == -0xfff) {
      auStack_3b8._448_8_ = (_func_void *)0x154858;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    auStack_3b8._448_8_ = (_func_void *)0x154868;
    empty_scandir_cb_cold_1();
LAB_00154868:
    auStack_3b8._448_8_ = (_func_void *)0x15486d;
    empty_scandir_cb_cold_2();
LAB_0015486d:
    auStack_3b8._448_8_ = (_func_void *)0x154872;
    empty_scandir_cb_cold_3();
LAB_00154872:
    auStack_3b8._448_8_ = (_func_void *)0x154877;
    empty_scandir_cb_cold_4();
  }
  auStack_3b8._448_8_ = run_test_fs_scandir_non_existent_dir;
  empty_scandir_cb_cold_5();
  uStack_3d0._0_4_ = 0x15488b;
  uStack_3d0._4_4_ = 0;
  auStack_3b8._440_8_ = pcVar8;
  auStack_3b8._448_8_ = (uv_fs_t *)&stack0xfffffffffffffe38;
  loop = uv_default_loop();
  pcVar8 = "./non_existent_dir/";
  req_00 = (uv_fs_t *)auStack_3b8;
  uStack_3d0._0_4_ = 0x1548ad;
  uStack_3d0._4_4_ = 0;
  uv_fs_rmdir((uv_loop_t *)0x0,req_00,"./non_existent_dir/",(uv_fs_cb)0x0);
  uStack_3d0._0_4_ = 0x1548b5;
  uStack_3d0._4_4_ = 0;
  uv_fs_req_cleanup(req_00);
  uStack_3d0._0_4_ = 0x1548c7;
  uStack_3d0._4_4_ = 0;
  memset(req_00,0xdb,0x1b8);
  puVar5 = (uv_loop_t *)0x0;
  uStack_3d0._0_4_ = 0x1548d9;
  uStack_3d0._4_4_ = 0;
  iVar2 = uv_fs_scandir((uv_loop_t *)0x0,req_00,"./non_existent_dir/",0,(uv_fs_cb)0x0);
  if (iVar2 == -2) {
    if ((void *)auStack_3b8._88_8_ != (void *)0xfffffffffffffffe) goto LAB_001549a7;
    if ((void *)auStack_3b8._96_8_ != (void *)0x0) goto LAB_001549ac;
    puVar5 = (uv_loop_t *)auStack_3b8;
    uStack_3d0._0_4_ = 0x154907;
    uStack_3d0._4_4_ = 0;
    iVar2 = uv_fs_scandir_next((uv_fs_t *)puVar5,&uStack_3c8);
    if (iVar2 != -2) goto LAB_001549b1;
    uStack_3d0._0_4_ = 0x15491a;
    uStack_3d0._4_4_ = 0;
    uv_fs_req_cleanup((uv_fs_t *)auStack_3b8);
    uStack_3d0._0_4_ = 0x15493d;
    uStack_3d0._4_4_ = 0;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"./non_existent_dir/",0,non_existent_scandir_cb);
    if (iVar2 != 0) goto LAB_001549b6;
    if (scandir_cb_count != 0) goto LAB_001549bb;
    uStack_3d0._0_4_ = 0x154958;
    uStack_3d0._4_4_ = 0;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_001549c0;
    uStack_3d0._0_4_ = 0x154966;
    uStack_3d0._4_4_ = 0;
    pcVar8 = (char *)uv_default_loop();
    uStack_3d0._0_4_ = 0x15497a;
    uStack_3d0._4_4_ = 0;
    uv_walk((uv_loop_t *)pcVar8,close_walk_cb,(void *)0x0);
    uStack_3d0._0_4_ = 0x154984;
    uStack_3d0._4_4_ = 0;
    uv_run((uv_loop_t *)pcVar8,UV_RUN_DEFAULT);
    uStack_3d0._0_4_ = 0x154989;
    uStack_3d0._4_4_ = 0;
    puVar5 = uv_default_loop();
    uStack_3d0._0_4_ = 0x154991;
    uStack_3d0._4_4_ = 0;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    uStack_3d0._0_4_ = 0x1549a7;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_1();
LAB_001549a7:
    uStack_3d0._0_4_ = 0x1549ac;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_2();
LAB_001549ac:
    uStack_3d0._0_4_ = 0x1549b1;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_3();
LAB_001549b1:
    uStack_3d0._0_4_ = 0x1549b6;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_4();
LAB_001549b6:
    uStack_3d0._0_4_ = 0x1549bb;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_5();
LAB_001549bb:
    uStack_3d0._0_4_ = 0x1549c0;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_6();
LAB_001549c0:
    uStack_3d0._0_4_ = 0x1549c5;
    uStack_3d0._4_4_ = 0;
    run_test_fs_scandir_non_existent_dir_cold_7();
  }
  uStack_3d0 = non_existent_scandir_cb;
  run_test_fs_scandir_non_existent_dir_cold_8();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00154a29;
    if (scandir_req.result != -2) goto LAB_00154a2e;
    if (scandir_req.ptr != (void *)0x0) goto LAB_00154a33;
    puStack_3e8 = (uv_loop_t *)0x154a08;
    iVar2 = uv_fs_scandir_next(&scandir_req,(uv_dirent_t *)auStack_3d8);
    if (iVar2 == -2) {
      puStack_3e8 = (uv_loop_t *)0x154a19;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    puStack_3e8 = (uv_loop_t *)0x154a29;
    non_existent_scandir_cb_cold_1();
LAB_00154a29:
    puStack_3e8 = (uv_loop_t *)0x154a2e;
    non_existent_scandir_cb_cold_2();
LAB_00154a2e:
    puStack_3e8 = (uv_loop_t *)0x154a33;
    non_existent_scandir_cb_cold_3();
LAB_00154a33:
    puStack_3e8 = (uv_loop_t *)0x154a38;
    non_existent_scandir_cb_cold_4();
  }
  puStack_3e8 = (uv_loop_t *)run_test_fs_scandir_file;
  non_existent_scandir_cb_cold_5();
  pcStack_3f0 = (code *)0x154a43;
  puStack_3e8 = (uv_loop_t *)pcVar8;
  loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  pcStack_3f0 = (code *)0x154a64;
  iVar2 = uv_fs_scandir((uv_loop_t *)0x0,&scandir_req,"test/fixtures/empty_file",0,(uv_fs_cb)0x0);
  if (iVar2 == -0x14) {
    puVar9 = &scandir_req;
    pcStack_3f0 = (code *)0x154a7c;
    uv_fs_req_cleanup(&scandir_req);
    pcStack_3f0 = (code *)0x154a9b;
    puVar5 = loop;
    iVar2 = uv_fs_scandir(loop,&scandir_req,"test/fixtures/empty_file",0,file_scandir_cb);
    if (iVar2 != 0) goto LAB_00154afc;
    if (scandir_cb_count != 0) goto LAB_00154b01;
    pcStack_3f0 = (code *)0x154ab6;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (scandir_cb_count != 1) goto LAB_00154b06;
    pcStack_3f0 = (code *)0x154ac4;
    puVar9 = (uv_fs_t *)uv_default_loop();
    pcStack_3f0 = (code *)0x154ad8;
    uv_walk((uv_loop_t *)puVar9,close_walk_cb,(void *)0x0);
    pcStack_3f0 = (code *)0x154ae2;
    uv_run((uv_loop_t *)puVar9,UV_RUN_DEFAULT);
    pcStack_3f0 = (code *)0x154ae7;
    puVar5 = uv_default_loop();
    pcStack_3f0 = (code *)0x154aef;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_3f0 = (code *)0x154afc;
    run_test_fs_scandir_file_cold_1();
    puVar9 = (uv_fs_t *)pcVar8;
LAB_00154afc:
    pcStack_3f0 = (code *)0x154b01;
    run_test_fs_scandir_file_cold_2();
LAB_00154b01:
    pcStack_3f0 = (code *)0x154b06;
    run_test_fs_scandir_file_cold_3();
LAB_00154b06:
    pcStack_3f0 = (code *)0x154b0b;
    run_test_fs_scandir_file_cold_4();
  }
  pcStack_3f0 = file_scandir_cb;
  run_test_fs_scandir_file_cold_5();
  if (puVar5 == (uv_loop_t *)&scandir_req) {
    if (scandir_req.fs_type != UV_FS_SCANDIR) goto LAB_00154b53;
    if (scandir_req.result != -0x14) goto LAB_00154b58;
    if (scandir_req.ptr == (void *)0x0) {
      puStack_3f8 = (uv_fs_t *)0x154b46;
      pcStack_3f0._0_4_ = extraout_EAX_01;
      uv_fs_req_cleanup(&scandir_req);
      scandir_cb_count = scandir_cb_count + 1;
      return (int)pcStack_3f0;
    }
  }
  else {
    puStack_3f8 = (uv_fs_t *)0x154b53;
    file_scandir_cb_cold_1();
LAB_00154b53:
    puStack_3f8 = (uv_fs_t *)0x154b58;
    file_scandir_cb_cold_2();
LAB_00154b58:
    puStack_3f8 = (uv_fs_t *)0x154b5d;
    file_scandir_cb_cold_3();
  }
  puStack_3f8 = (uv_fs_t *)run_test_fs_open_dir;
  file_scandir_cb_cold_4();
  puStack_400 = (uv_loop_t *)puVar9;
  puStack_3f8 = req_00;
  loop = uv_default_loop();
  puVar5 = (uv_loop_t *)0x0;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&uStack_5b8,".",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    run_test_fs_open_dir_cold_1();
LAB_00154c60:
    run_test_fs_open_dir_cold_2();
LAB_00154c65:
    run_test_fs_open_dir_cold_3();
LAB_00154c6a:
    run_test_fs_open_dir_cold_4();
LAB_00154c6f:
    run_test_fs_open_dir_cold_5();
LAB_00154c74:
    run_test_fs_open_dir_cold_6();
LAB_00154c79:
    run_test_fs_open_dir_cold_7();
  }
  else {
    if (uStack_5b8.result < 0) goto LAB_00154c60;
    if (uStack_5b8.ptr != (void *)0x0) goto LAB_00154c65;
    uv_fs_req_cleanup(&uStack_5b8);
    puVar5 = (uv_loop_t *)0x0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&uStack_5b8,iVar2,(uv_fs_cb)0x0);
    req_00 = &uStack_5b8;
    if (iVar2 != 0) goto LAB_00154c6a;
    puVar5 = loop;
    iVar2 = uv_fs_open(loop,&uStack_5b8,".",0,0,open_cb_simple);
    req_00 = &uStack_5b8;
    if (iVar2 != 0) goto LAB_00154c6f;
    req_00 = &uStack_5b8;
    if (open_cb_count != 0) goto LAB_00154c74;
    puVar5 = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    req_00 = &uStack_5b8;
    if (open_cb_count != 1) goto LAB_00154c79;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    uv_run(puVar5,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar2 = uv_loop_close(puVar5);
    req_00 = &uStack_5b8;
    if (iVar2 == 0) {
      return 0;
    }
  }
  run_test_fs_open_dir_cold_8();
  if (puVar5->backend_fd == 1) {
    puVar6 = (uv_loop_t *)puVar5->watcher_queue[0];
    if ((long)puVar6 < 0) goto LAB_00154cab;
    open_cb_count = open_cb_count + 1;
    puVar6 = puVar5;
    if (puVar5->watchers != (uv__io_t **)0x0) {
      uv_fs_req_cleanup((uv_fs_t *)puVar5);
      return extraout_EAX_02;
    }
  }
  else {
    open_cb_simple_cold_1();
    puVar6 = extraout_RAX;
LAB_00154cab:
    open_cb_simple_cold_3();
  }
  iVar2 = (int)puVar6;
  open_cb_simple_cold_2();
  fs_file_open_append(iVar2);
  fs_file_open_append(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_file_open_append_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_file_open_append_cold_1();
LAB_00155034:
    fs_file_open_append_cold_2();
LAB_00155039:
    fs_file_open_append_cold_3();
LAB_0015503e:
    fs_file_open_append_cold_4();
LAB_00155043:
    fs_file_open_append_cold_5();
LAB_00155048:
    fs_file_open_append_cold_6();
LAB_0015504d:
    fs_file_open_append_cold_7();
LAB_00155052:
    fs_file_open_append_cold_8();
LAB_00155057:
    fs_file_open_append_cold_9();
LAB_0015505c:
    fs_file_open_append_cold_10();
LAB_00155061:
    fs_file_open_append_cold_11();
LAB_00155066:
    fs_file_open_append_cold_12();
LAB_0015506b:
    fs_file_open_append_cold_13();
LAB_00155070:
    fs_file_open_append_cold_14();
LAB_00155075:
    fs_file_open_append_cold_15();
LAB_0015507a:
    fs_file_open_append_cold_16();
LAB_0015507f:
    fs_file_open_append_cold_17();
LAB_00155084:
    fs_file_open_append_cold_18();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155034;
    uv_fs_req_cleanup(&open_req1);
    iov = uv_buf_init(test_buf,0xd);
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155039;
    if (write_req.result < 0) goto LAB_0015503e;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155043;
    if (close_req.result != 0) goto LAB_00155048;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x402,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015504d;
    if (open_req1.result._4_4_ < 0) goto LAB_00155052;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(test_buf,0xd);
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155057;
    if (write_req.result < 0) goto LAB_0015505c;
    uv_fs_req_cleanup(&write_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155061;
    if (close_req.result != 0) goto LAB_00155066;
    uv_fs_req_cleanup(&close_req);
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0x100,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_0015506b;
    if (open_req1.result._4_4_ < 0) goto LAB_00155070;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(buf,0x20);
    iov = uVar15;
    uVar3 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    printf("read = %d\n",(ulong)uVar3);
    if (uVar3 != 0x1a) goto LAB_00155075;
    if (read_req.result != 0x1a) goto LAB_0015507a;
    auVar14[0] = -(buf[10] == 'r');
    auVar14[1] = -(buf[0xb] == '\n');
    auVar14[2] = -(buf[0xc] == '\0');
    auVar14[3] = -(buf[0xd] == 't');
    auVar14[4] = -(buf[0xe] == 'e');
    auVar14[5] = -(buf[0xf] == 's');
    auVar14[6] = -(buf[0x10] == 't');
    auVar14[7] = -(buf[0x11] == '-');
    auVar14[8] = -(buf[0x12] == 'b');
    auVar14[9] = -(buf[0x13] == 'u');
    auVar14[10] = -(buf[0x14] == 'f');
    auVar14[0xb] = -(buf[0x15] == 'f');
    auVar14[0xc] = -(buf[0x16] == 'e');
    auVar14[0xd] = -(buf[0x17] == 'r');
    auVar14[0xe] = -(buf[0x18] == '\n');
    auVar14[0xf] = -(buf[0x19] == '\0');
    auVar13[0] = -(buf[0] == 't');
    auVar13[1] = -(buf[1] == 'e');
    auVar13[2] = -(buf[2] == 's');
    auVar13[3] = -(buf[3] == 't');
    auVar13[4] = -(buf[4] == '-');
    auVar13[5] = -(buf[5] == 'b');
    auVar13[6] = -(buf[6] == 'u');
    auVar13[7] = -(buf[7] == 'f');
    auVar13[8] = -(buf[8] == 'f');
    auVar13[9] = -(buf[9] == 'e');
    auVar13[10] = -(buf[10] == 'r');
    auVar13[0xb] = -(buf[0xb] == '\n');
    auVar13[0xc] = -(buf[0xc] == '\0');
    auVar13[0xd] = -(buf[0xd] == 't');
    auVar13[0xe] = -(buf[0xe] == 'e');
    auVar13[0xf] = -(buf[0xf] == 's');
    auVar13 = auVar13 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0015507f;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155084;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  fs_file_open_append_cold_19();
  puVar5 = (uv_loop_t *)0x194385;
  puStack_600 = (uv_loop_t *)0x1550a2;
  unlink("test_file");
  puStack_600 = (uv_loop_t *)0x1550ae;
  unlink("test_file2");
  puStack_600 = (uv_loop_t *)0x1550b3;
  loop = uv_default_loop();
  iVar4 = 0;
  puStack_600 = (uv_loop_t *)0x1550d9;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_600 = (uv_loop_t *)0x1553cf;
    run_test_fs_rename_to_existing_file_cold_1();
LAB_001553cf:
    puStack_600 = (uv_loop_t *)0x1553d4;
    run_test_fs_rename_to_existing_file_cold_2();
LAB_001553d4:
    puStack_600 = (uv_loop_t *)0x1553d9;
    run_test_fs_rename_to_existing_file_cold_3();
LAB_001553d9:
    puStack_600 = (uv_loop_t *)0x1553de;
    run_test_fs_rename_to_existing_file_cold_4();
LAB_001553de:
    puStack_600 = (uv_loop_t *)0x1553e3;
    run_test_fs_rename_to_existing_file_cold_5();
LAB_001553e3:
    puStack_600 = (uv_loop_t *)0x1553e8;
    run_test_fs_rename_to_existing_file_cold_6();
LAB_001553e8:
    puStack_600 = (uv_loop_t *)0x1553ed;
    run_test_fs_rename_to_existing_file_cold_7();
LAB_001553ed:
    puStack_600 = (uv_loop_t *)0x1553f2;
    run_test_fs_rename_to_existing_file_cold_8();
LAB_001553f2:
    puStack_600 = (uv_loop_t *)0x1553f7;
    run_test_fs_rename_to_existing_file_cold_9();
LAB_001553f7:
    puStack_600 = (uv_loop_t *)0x1553fc;
    run_test_fs_rename_to_existing_file_cold_10();
LAB_001553fc:
    puStack_600 = (uv_loop_t *)0x155401;
    run_test_fs_rename_to_existing_file_cold_11();
LAB_00155401:
    puStack_600 = (uv_loop_t *)0x155406;
    run_test_fs_rename_to_existing_file_cold_12();
LAB_00155406:
    puStack_600 = (uv_loop_t *)0x15540b;
    run_test_fs_rename_to_existing_file_cold_13();
LAB_0015540b:
    puStack_600 = (uv_loop_t *)0x155410;
    run_test_fs_rename_to_existing_file_cold_14();
LAB_00155410:
    puStack_600 = (uv_loop_t *)0x155415;
    run_test_fs_rename_to_existing_file_cold_15();
LAB_00155415:
    puStack_600 = (uv_loop_t *)0x15541a;
    run_test_fs_rename_to_existing_file_cold_16();
LAB_0015541a:
    puStack_600 = (uv_loop_t *)0x15541f;
    run_test_fs_rename_to_existing_file_cold_17();
LAB_0015541f:
    puStack_600 = (uv_loop_t *)0x155424;
    run_test_fs_rename_to_existing_file_cold_18();
LAB_00155424:
    puStack_600 = (uv_loop_t *)0x155429;
    run_test_fs_rename_to_existing_file_cold_19();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001553cf;
    puStack_600 = (uv_loop_t *)0x1550fb;
    uv_fs_req_cleanup(&open_req1);
    puStack_600 = (uv_loop_t *)0x15510c;
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x15514a;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001553d4;
    if (write_req.result < 0) goto LAB_001553d9;
    puStack_600 = (uv_loop_t *)0x15516c;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x155182;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553de;
    if (close_req.result != 0) goto LAB_001553e3;
    puStack_600 = (uv_loop_t *)0x1551a4;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x1551c7;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0x41,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001553e8;
    if (open_req1.result._4_4_ < 0) goto LAB_001553ed;
    puStack_600 = (uv_loop_t *)0x1551e9;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x1551ff;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553f2;
    if (close_req.result != 0) goto LAB_001553f7;
    puStack_600 = (uv_loop_t *)0x155221;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x155240;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,&rename_req,"test_file","test_file2",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_001553fc;
    if (rename_req.result != 0) goto LAB_00155401;
    puStack_600 = (uv_loop_t *)0x155262;
    uv_fs_req_cleanup(&rename_req);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x15527f;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file2",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155406;
    if (open_req1.result._4_4_ < 0) goto LAB_0015540b;
    puStack_600 = (uv_loop_t *)0x1552a1;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_600 = (uv_loop_t *)0x1552c3;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x155301;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_00155410;
    if (read_req.result < 0) goto LAB_00155415;
    iVar4 = 0x2fbca0;
    puStack_600 = (uv_loop_t *)0x15532a;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_0015541a;
    puStack_600 = (uv_loop_t *)0x15533e;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    puStack_600 = (uv_loop_t *)0x155354;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015541f;
    if (close_req.result != 0) goto LAB_00155424;
    puStack_600 = (uv_loop_t *)0x155376;
    uv_fs_req_cleanup(&close_req);
    puStack_600 = (uv_loop_t *)0x155382;
    unlink("test_file");
    puStack_600 = (uv_loop_t *)0x15538e;
    unlink("test_file2");
    puStack_600 = (uv_loop_t *)0x155393;
    puVar5 = uv_default_loop();
    puStack_600 = (uv_loop_t *)0x1553a7;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    puStack_600 = (uv_loop_t *)0x1553b1;
    uv_run(puVar5,UV_RUN_DEFAULT);
    puStack_600 = (uv_loop_t *)0x1553b6;
    puVar6 = uv_default_loop();
    puStack_600 = (uv_loop_t *)0x1553be;
    iVar2 = uv_loop_close(puVar6);
    iVar4 = (int)puVar6;
    if (iVar2 == 0) {
      return 0;
    }
  }
  puStack_600 = (uv_loop_t *)run_test_fs_read_bufs;
  run_test_fs_rename_to_existing_file_cold_20();
  puStack_608 = (uv_fs_t *)0x155434;
  puStack_600 = puVar5;
  fs_read_bufs(iVar4);
  puStack_608 = (uv_fs_t *)0x155439;
  fs_read_bufs(iVar4);
  puStack_608 = (uv_fs_t *)0x15543e;
  puVar5 = uv_default_loop();
  puStack_608 = (uv_fs_t *)0x155452;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  puStack_608 = (uv_fs_t *)0x15545c;
  uv_run(puVar5,UV_RUN_DEFAULT);
  puStack_608 = (uv_fs_t *)0x155461;
  puVar6 = uv_default_loop();
  puStack_608 = (uv_fs_t *)0x155469;
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_608 = (uv_fs_t *)fs_read_bufs;
  run_test_fs_read_bufs_cold_1();
  iVar4 = 0;
  puStack_610 = puVar5;
  puStack_608 = req_00;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test/fixtures/lorem_ipsum.txt",0,0,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    fs_read_bufs_cold_1();
LAB_001556d5:
    fs_read_bufs_cold_2();
LAB_001556da:
    fs_read_bufs_cold_3();
LAB_001556df:
    fs_read_bufs_cold_4();
LAB_001556e4:
    fs_read_bufs_cold_5();
LAB_001556e9:
    fs_read_bufs_cold_6();
LAB_001556ee:
    fs_read_bufs_cold_7();
LAB_001556f3:
    fs_read_bufs_cold_8();
LAB_001556f8:
    fs_read_bufs_cold_9();
LAB_001556fd:
    fs_read_bufs_cold_10();
LAB_00155702:
    fs_read_bufs_cold_11();
LAB_00155707:
    fs_read_bufs_cold_12();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001556d5;
    uv_fs_req_cleanup(&open_req1);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556da;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)0x0,1,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556df;
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_958,0,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_001556e4;
    uStack_958 = uv_buf_init(acStack_918,0x100);
    uStack_948 = uv_buf_init(acStack_818,0x100);
    uStack_938 = uv_buf_init(acStack_718,0x80);
    uStack_928 = uv_buf_init(acStack_698,0x80);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_958,2,0,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0x1be) goto LAB_001556e9;
    if (read_req.result != 0x1be) goto LAB_001556ee;
    req_00 = &read_req;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_938,2,0x100,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0xbe) goto LAB_001556f3;
    if (read_req.result != 0xbe) goto LAB_001556f8;
    uv_fs_req_cleanup(&read_req);
    pcVar8 = uStack_948.base;
    pcVar12 = uStack_948.base;
    iVar2 = bcmp(uStack_948.base,uStack_938.base,0x80);
    iVar4 = (int)pcVar12;
    if (iVar2 != 0) goto LAB_001556fd;
    pcVar8 = pcVar8 + 0x80;
    iVar2 = bcmp(pcVar8,uStack_928.base,0x3e);
    iVar4 = (int)pcVar8;
    if (iVar2 != 0) goto LAB_00155702;
    iVar4 = 0;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155707;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      return extraout_EAX_03;
    }
  }
  fs_read_bufs_cold_13();
  fs_read_file_eof(iVar4);
  fs_read_file_eof(iVar4);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_read_file_eof_cold_1();
  puVar9 = (uv_fs_t *)0x194385;
  puStack_990 = (uv_fs_t *)0x15576d;
  unlink("test_file");
  puStack_990 = (uv_fs_t *)0x155772;
  loop = uv_default_loop();
  iVar4 = 0;
  puStack_990 = (uv_fs_t *)0x155798;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar2 < 0) {
    puStack_990 = (uv_fs_t *)0x1559f5;
    fs_read_file_eof_cold_1();
LAB_001559f5:
    puStack_990 = (uv_fs_t *)0x1559fa;
    fs_read_file_eof_cold_2();
LAB_001559fa:
    puStack_990 = (uv_fs_t *)0x1559ff;
    fs_read_file_eof_cold_3();
LAB_001559ff:
    puStack_990 = (uv_fs_t *)0x155a04;
    fs_read_file_eof_cold_4();
LAB_00155a04:
    puStack_990 = (uv_fs_t *)0x155a09;
    fs_read_file_eof_cold_5();
LAB_00155a09:
    puStack_990 = (uv_fs_t *)0x155a0e;
    fs_read_file_eof_cold_6();
LAB_00155a0e:
    puStack_990 = (uv_fs_t *)0x155a13;
    fs_read_file_eof_cold_7();
LAB_00155a13:
    puStack_990 = (uv_fs_t *)0x155a18;
    fs_read_file_eof_cold_8();
LAB_00155a18:
    puStack_990 = (uv_fs_t *)0x155a1d;
    fs_read_file_eof_cold_9();
LAB_00155a1d:
    puStack_990 = (uv_fs_t *)0x155a22;
    fs_read_file_eof_cold_10();
LAB_00155a22:
    puStack_990 = (uv_fs_t *)0x155a27;
    fs_read_file_eof_cold_11();
LAB_00155a27:
    puStack_990 = (uv_fs_t *)0x155a2c;
    fs_read_file_eof_cold_12();
LAB_00155a2c:
    puStack_990 = (uv_fs_t *)0x155a31;
    fs_read_file_eof_cold_13();
LAB_00155a31:
    puStack_990 = (uv_fs_t *)0x155a36;
    fs_read_file_eof_cold_14();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_001559f5;
    puStack_990 = (uv_fs_t *)0x1557ba;
    uv_fs_req_cleanup(&open_req1);
    puStack_990 = (uv_fs_t *)0x1557cb;
    uVar15 = uv_buf_init(test_buf,0xd);
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x155809;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001559fa;
    if (write_req.result < 0) goto LAB_001559ff;
    puStack_990 = (uv_fs_t *)0x15582b;
    uv_fs_req_cleanup(&write_req);
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x155841;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a04;
    if (close_req.result != 0) goto LAB_00155a09;
    puStack_990 = (uv_fs_t *)0x155863;
    uv_fs_req_cleanup(&close_req);
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x155880;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00155a0e;
    if (open_req1.result._4_4_ < 0) goto LAB_00155a13;
    puStack_990 = (uv_fs_t *)0x1558a2;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    puStack_990 = (uv_fs_t *)0x1558c4;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x155902;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar2 < 0) goto LAB_00155a18;
    if (read_req.result < 0) goto LAB_00155a1d;
    iVar4 = 0x2fbca0;
    puStack_990 = (uv_fs_t *)0x15592b;
    iVar2 = strcmp(buf,test_buf);
    if (iVar2 != 0) goto LAB_00155a22;
    puVar9 = &read_req;
    puStack_990 = (uv_fs_t *)0x155942;
    uv_fs_req_cleanup(&read_req);
    puStack_990 = (uv_fs_t *)0x155953;
    uVar15 = uv_buf_init(buf,0x20);
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x15598d;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,read_req.result,
                       (uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a27;
    if (read_req.result != 0) goto LAB_00155a2c;
    puStack_990 = (uv_fs_t *)0x1559af;
    uv_fs_req_cleanup(&read_req);
    iVar4 = 0;
    puStack_990 = (uv_fs_t *)0x1559c5;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00155a31;
    if (close_req.result == 0) {
      puStack_990 = (uv_fs_t *)0x1559df;
      uv_fs_req_cleanup(&close_req);
      iVar2 = unlink("test_file");
      return iVar2;
    }
  }
  puStack_990 = (uv_fs_t *)run_test_fs_write_multiple_bufs;
  fs_read_file_eof_cold_15();
  puStack_998 = (uv_fs_t *)0x155a41;
  puStack_990 = puVar9;
  fs_write_multiple_bufs(iVar4);
  puStack_998 = (uv_fs_t *)0x155a46;
  fs_write_multiple_bufs(iVar4);
  puStack_998 = (uv_fs_t *)0x155a4b;
  puVar5 = uv_default_loop();
  puStack_998 = (uv_fs_t *)0x155a5f;
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  puStack_998 = (uv_fs_t *)0x155a69;
  uv_run(puVar5,UV_RUN_DEFAULT);
  puStack_998 = (uv_fs_t *)0x155a6e;
  puVar6 = uv_default_loop();
  puStack_998 = (uv_fs_t *)0x155a76;
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return 0;
  }
  puStack_998 = (uv_fs_t *)fs_write_multiple_bufs;
  run_test_fs_write_multiple_bufs_cold_1();
  puStack_9a0 = puVar5;
  puStack_998 = req_00;
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0;
  iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x41,0x180,(uv_fs_cb)0x0);
  if (iVar4 < 0) {
    fs_write_multiple_bufs_cold_1();
LAB_00155f16:
    fs_write_multiple_bufs_cold_2();
LAB_00155f1b:
    fs_write_multiple_bufs_cold_3();
LAB_00155f20:
    fs_write_multiple_bufs_cold_4();
LAB_00155f25:
    fs_write_multiple_bufs_cold_5();
LAB_00155f2a:
    fs_write_multiple_bufs_cold_6();
LAB_00155f2f:
    fs_write_multiple_bufs_cold_7();
LAB_00155f34:
    fs_write_multiple_bufs_cold_8();
LAB_00155f39:
    fs_write_multiple_bufs_cold_9();
LAB_00155f3e:
    fs_write_multiple_bufs_cold_10();
LAB_00155f43:
    fs_write_multiple_bufs_cold_11();
LAB_00155f48:
    fs_write_multiple_bufs_cold_12();
LAB_00155f4d:
    fs_write_multiple_bufs_cold_13();
LAB_00155f52:
    fs_write_multiple_bufs_cold_14();
LAB_00155f57:
    fs_write_multiple_bufs_cold_15();
LAB_00155f5c:
    fs_write_multiple_bufs_cold_16();
LAB_00155f61:
    fs_write_multiple_bufs_cold_19();
LAB_00155f66:
    fs_write_multiple_bufs_cold_20();
LAB_00155f6b:
    fs_write_multiple_bufs_cold_21();
LAB_00155f70:
    fs_write_multiple_bufs_cold_22();
LAB_00155f75:
    fs_write_multiple_bufs_cold_23();
LAB_00155f7a:
    fs_write_multiple_bufs_cold_24();
LAB_00155f7f:
    fs_write_multiple_bufs_cold_25();
LAB_00155f84:
    fs_write_multiple_bufs_cold_17();
  }
  else {
    if (open_req1.result._4_4_ < 0) goto LAB_00155f16;
    uv_fs_req_cleanup(&open_req1);
    uStack_9c8 = uv_buf_init(test_buf,0xd);
    uStack_9b8 = uv_buf_init(test_buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&uStack_9c8,2,0,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f1b;
    if (write_req.result < 0) goto LAB_00155f20;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00155f25;
    if (close_req.result != 0) goto LAB_00155f2a;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f2f;
    if (open_req1.result._4_4_ < 0) goto LAB_00155f34;
    uv_fs_req_cleanup(&open_req1);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    buf2[8] = '\0';
    buf2[9] = '\0';
    buf2[10] = '\0';
    buf2[0xb] = '\0';
    buf2[0xc] = '\0';
    buf2[0xd] = '\0';
    buf2[0xe] = '\0';
    buf2[0xf] = '\0';
    buf2[0x10] = '\0';
    buf2[0x11] = '\0';
    buf2[0x12] = '\0';
    buf2[0x13] = '\0';
    buf2[0x14] = '\0';
    buf2[0x15] = '\0';
    buf2[0x16] = '\0';
    buf2[0x17] = '\0';
    buf2[0x18] = '\0';
    buf2[0x19] = '\0';
    buf2[0x1a] = '\0';
    buf2[0x1b] = '\0';
    buf2[0x1c] = '\0';
    buf2[0x1d] = '\0';
    buf2[0x1e] = '\0';
    buf2[0x1f] = '\0';
    uStack_9c8 = uv_buf_init(buf,0xd);
    uStack_9b8 = uv_buf_init(buf2,0xf);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,0,1);
    if (_Var7 != 0) goto LAB_00155f39;
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_9c8,2,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f3e;
    if (read_req.result != 0x1c) goto LAB_00155f43;
    iVar2 = 0x2fbca0;
    iVar4 = strcmp(buf,test_buf);
    if (iVar4 != 0) goto LAB_00155f48;
    iVar2 = 0x2fd090;
    iVar4 = strcmp(buf2,test_buf2);
    if (iVar4 != 0) goto LAB_00155f4d;
    uv_fs_req_cleanup(&read_req);
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_00155f52;
    if (read_req.result != 0) goto LAB_00155f57;
    uv_fs_req_cleanup(&read_req);
    uStack_9c8 = uv_buf_init(buf,0xd);
    uStack_9b8 = uv_buf_init(buf2,0xf);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_9c8,2,0,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f5c;
    if (read_req.result == 0x1c) {
LAB_00155e14:
      iVar2 = 0x2fbca0;
      iVar4 = strcmp(buf,test_buf);
      if (iVar4 != 0) goto LAB_00155f61;
      iVar2 = 0x2fd090;
      iVar4 = strcmp(buf2,test_buf2);
      if (iVar4 != 0) goto LAB_00155f66;
      uv_fs_req_cleanup(&read_req);
      uVar15 = uv_buf_init(buf,0x20);
      iVar2 = 0;
      iov = uVar15;
      iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0x1c,
                         (uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_00155f6b;
      if (read_req.result != 0) goto LAB_00155f70;
      uv_fs_req_cleanup(&read_req);
      iVar2 = 0;
      iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
      if (iVar4 != 0) goto LAB_00155f75;
      if (close_req.result == 0) {
        uv_fs_req_cleanup(&close_req);
        iVar2 = unlink("test_file");
        return iVar2;
      }
      goto LAB_00155f7a;
    }
    if (read_req.result != 0xd) goto LAB_00155f7f;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&uStack_9b8,1,
                       read_req.result,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00155f84;
    if (read_req.result == 0xf) goto LAB_00155e14;
  }
  fs_write_multiple_bufs_cold_18();
  fs_write_alotof_bufs(iVar2);
  fs_write_alotof_bufs(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar5 = uv_default_loop();
  iVar2 = uv_loop_close(puVar5);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_cold_1();
  unlink("test_file");
  loop = uv_default_loop();
  iVar2 = 0xd4310;
  bufs = (uv_buf_t *)malloc(0xd4310);
  if (bufs == (uv_buf_t *)0x0) {
LAB_00156306:
    fs_write_alotof_bufs_cold_18();
LAB_0015630b:
    fs_write_alotof_bufs_cold_1();
LAB_00156310:
    fs_write_alotof_bufs_cold_2();
LAB_00156315:
    fs_write_alotof_bufs_cold_3();
LAB_0015631a:
    fs_write_alotof_bufs_cold_4();
LAB_0015631f:
    fs_write_alotof_bufs_cold_17();
LAB_00156324:
    fs_write_alotof_bufs_cold_5();
LAB_00156329:
    fs_write_alotof_bufs_cold_6();
LAB_0015632e:
    fs_write_alotof_bufs_cold_7();
LAB_00156333:
    fs_write_alotof_bufs_cold_8();
LAB_00156338:
    fs_write_alotof_bufs_cold_9();
LAB_0015633d:
    fs_write_alotof_bufs_cold_10();
LAB_00156342:
    fs_write_alotof_bufs_cold_12();
LAB_00156347:
    fs_write_alotof_bufs_cold_13();
LAB_0015634c:
    fs_write_alotof_bufs_cold_14();
LAB_00156351:
    fs_write_alotof_bufs_cold_15();
  }
  else {
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015630b;
    if (open_req1.result._4_4_ < 0) goto LAB_00156310;
    uv_fs_req_cleanup(&open_req1);
    lVar11 = 8;
    do {
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                        (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00156315;
    if (write_req.result != 0xac67d) goto LAB_0015631a;
    uv_fs_req_cleanup(&write_req);
    iVar2 = 0xac67d;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_0015631f;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)bufs + lVar11 + -8) = uVar15.base;
      *(size_t *)((long)&bufs->base + lVar11) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00156324;
    if (close_req.result != 0) goto LAB_00156329;
    uv_fs_req_cleanup(&close_req);
    iVar2 = 0;
    iVar4 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0,0,(uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_0015632e;
    if (open_req1.result._4_4_ < 0) goto LAB_00156333;
    uv_fs_req_cleanup(&open_req1);
    iVar2 = 0;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,bufs,0xd431,-1,
                       (uv_fs_cb)0x0);
    if (iVar4 < 0) goto LAB_00156338;
    if (read_req.result != 0x3400) goto LAB_0015633d;
    lVar11 = 0;
    do {
      pcVar12 = pcVar8 + lVar11;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      iVar2 = (int)pcVar12;
      if (iVar4 != 0) {
        fs_write_alotof_bufs_cold_11();
        goto LAB_00156306;
      }
      lVar11 = lVar11 + 0xd;
    } while (lVar11 != 0x3400);
    uv_fs_req_cleanup(&read_req);
    free(pcVar8);
    iVar2 = (uv_file)open_req1.result;
    _Var7 = lseek64((uv_file)open_req1.result,write_req.result,0);
    if (_Var7 != write_req.result) goto LAB_00156342;
    uVar15 = uv_buf_init(buf,0x20);
    iVar2 = 0;
    iov = uVar15;
    iVar4 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,-1,(uv_fs_cb)0x0)
    ;
    if (iVar4 != 0) goto LAB_00156347;
    if (read_req.result != 0) goto LAB_0015634c;
    uv_fs_req_cleanup(&read_req);
    iVar2 = 0;
    iVar4 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar4 != 0) goto LAB_00156351;
    if (close_req.result == 0) {
      uv_fs_req_cleanup(&close_req);
      unlink("test_file");
      free(bufs);
      return extraout_EAX_04;
    }
  }
  fs_write_alotof_bufs_cold_16();
  fs_write_alotof_bufs_with_offset(iVar2);
  fs_write_alotof_bufs_with_offset(iVar2);
  puVar5 = uv_default_loop();
  uv_walk(puVar5,close_walk_cb,(void *)0x0);
  uv_run(puVar5,UV_RUN_DEFAULT);
  puVar6 = uv_default_loop();
  iVar2 = uv_loop_close(puVar6);
  if (iVar2 == 0) {
    return 0;
  }
  run_test_fs_write_alotof_bufs_with_offset_cold_1();
  puStack_a60 = (uv_loop_t *)0x1563bd;
  unlink("test_file");
  puStack_a60 = (uv_loop_t *)0x1563c2;
  loop = uv_default_loop();
  puStack_a60 = (uv_loop_t *)0x1563d3;
  puVar6 = (uv_loop_t *)malloc(0xd4310);
  if (puVar6 == (uv_loop_t *)0x0) {
LAB_0015671f:
    puVar6 = puVar5;
    puStack_a60 = (uv_loop_t *)0x156724;
    fs_write_alotof_bufs_with_offset_cold_17();
LAB_00156724:
    puStack_a60 = (uv_loop_t *)0x156729;
    fs_write_alotof_bufs_with_offset_cold_1();
LAB_00156729:
    puStack_a60 = (uv_loop_t *)0x15672e;
    fs_write_alotof_bufs_with_offset_cold_2();
LAB_0015672e:
    puStack_a60 = (uv_loop_t *)0x156733;
    fs_write_alotof_bufs_with_offset_cold_3();
LAB_00156733:
    puStack_a60 = (uv_loop_t *)0x156738;
    fs_write_alotof_bufs_with_offset_cold_4();
LAB_00156738:
    puStack_a60 = (uv_loop_t *)0x15673d;
    fs_write_alotof_bufs_with_offset_cold_5();
LAB_0015673d:
    puStack_a60 = (uv_loop_t *)0x156742;
    fs_write_alotof_bufs_with_offset_cold_6();
LAB_00156742:
    puStack_a60 = (uv_loop_t *)0x156747;
    fs_write_alotof_bufs_with_offset_cold_16();
LAB_00156747:
    puStack_a60 = (uv_loop_t *)0x15674c;
    fs_write_alotof_bufs_with_offset_cold_7();
LAB_0015674c:
    puStack_a60 = (uv_loop_t *)0x156751;
    fs_write_alotof_bufs_with_offset_cold_8();
LAB_00156751:
    puStack_a60 = (uv_loop_t *)0x156756;
    fs_write_alotof_bufs_with_offset_cold_10();
LAB_00156756:
    puStack_a60 = (uv_loop_t *)0x15675b;
    fs_write_alotof_bufs_with_offset_cold_11();
LAB_0015675b:
    puStack_a60 = (uv_loop_t *)0x156760;
    fs_write_alotof_bufs_with_offset_cold_12();
LAB_00156760:
    puStack_a60 = (uv_loop_t *)0x156765;
    fs_write_alotof_bufs_with_offset_cold_13();
LAB_00156765:
    puStack_a60 = (uv_loop_t *)0x15676a;
    fs_write_alotof_bufs_with_offset_cold_14();
  }
  else {
    puStack_a60 = (uv_loop_t *)0x156402;
    iVar2 = uv_fs_open((uv_loop_t *)0x0,&open_req1,"test_file",0x42,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156724;
    if (open_req1.result._4_4_ < 0) goto LAB_00156729;
    puStack_a60 = (uv_loop_t *)0x156424;
    uv_fs_req_cleanup(&open_req1);
    puStack_a60 = (uv_loop_t *)0x156435;
    uVar15 = uv_buf_init("0123456789",10);
    puStack_a60 = (uv_loop_t *)0x156473;
    iov = uVar15;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,&iov,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar2 != 10) goto LAB_0015672e;
    if (write_req.result != 10) goto LAB_00156733;
    puStack_a60 = (uv_loop_t *)0x156498;
    uv_fs_req_cleanup(&write_req);
    lVar11 = 8;
    do {
      puStack_a60 = (uv_loop_t *)0x1564b2;
      uVar15 = uv_buf_init(test_buf,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0xd4318);
    puStack_a60 = (uv_loop_t *)0x1564f3;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,&write_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                        0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156738;
    if (write_req.result != 0xac67d) goto LAB_0015673d;
    puStack_a60 = (uv_loop_t *)0x156518;
    uv_fs_req_cleanup(&write_req);
    puStack_a60 = (uv_loop_t *)0x156522;
    pcVar8 = (char *)malloc(0xac67d);
    if (pcVar8 == (char *)0x0) goto LAB_00156742;
    lVar11 = 8;
    pcVar12 = pcVar8;
    do {
      puStack_a60 = (uv_loop_t *)0x156544;
      uVar15 = uv_buf_init(pcVar12,0xd);
      *(char **)((long)puVar6->handle_queue + lVar11 + -0x18) = uVar15.base;
      *(size_t *)((long)puVar6->handle_queue + lVar11 + -0x10) = uVar15.len;
      lVar11 = lVar11 + 0x10;
      pcVar12 = pcVar12 + 0xd;
    } while (lVar11 != 0xd4318);
    puStack_a60 = (uv_loop_t *)0x156586;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,(uv_buf_t *)puVar6,
                       0xd431,10,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_00156747;
    lVar11 = 0xd;
    if (iVar2 != 0xd) {
      lVar11 = 0x3400;
    }
    if (read_req.result != lVar11) goto LAB_0015674c;
    pcVar12 = pcVar8;
    uVar10 = 0;
    do {
      puStack_a60 = (uv_loop_t *)0x1565d0;
      iVar4 = strncmp(pcVar12,test_buf,0xd);
      if (iVar4 != 0) {
        puStack_a60 = (uv_loop_t *)0x15671f;
        fs_write_alotof_bufs_with_offset_cold_9();
        puVar5 = puVar6;
        goto LAB_0015671f;
      }
      if (iVar2 == 0xd) break;
      pcVar12 = pcVar12 + 0xd;
      bVar1 = uVar10 < 0x3ff;
      uVar10 = uVar10 + 1;
    } while (bVar1);
    puStack_a60 = (uv_loop_t *)0x1565fd;
    uv_fs_req_cleanup(&read_req);
    puStack_a60 = (uv_loop_t *)0x156605;
    free(pcVar8);
    puStack_a60 = (uv_loop_t *)0x15661c;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,&stat_req,"test_file",(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156751;
    if (*(long *)((long)stat_req.ptr + 0x38) != write_req.result + 10) goto LAB_00156756;
    puStack_a60 = (uv_loop_t *)0x156650;
    uv_fs_req_cleanup(&stat_req);
    puStack_a60 = (uv_loop_t *)0x156661;
    uVar15 = uv_buf_init(buf,0x20);
    puStack_a60 = (uv_loop_t *)0x1566a2;
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,
                       write_req.result + 10,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_0015675b;
    if (read_req.result != 0) goto LAB_00156760;
    puStack_a60 = (uv_loop_t *)0x1566c4;
    uv_fs_req_cleanup(&read_req);
    puStack_a60 = (uv_loop_t *)0x1566da;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 != 0) goto LAB_00156765;
    if (close_req.result == 0) {
      puStack_a60 = (uv_loop_t *)0x1566f8;
      uv_fs_req_cleanup(&close_req);
      puStack_a60 = (uv_loop_t *)0x156704;
      unlink("test_file");
      free(puVar6);
      return extraout_EAX_05;
    }
  }
  puStack_a60 = (uv_loop_t *)run_test_fs_read_dir;
  fs_write_alotof_bufs_with_offset_cold_15();
  puStack_a60 = puVar6;
  loop = uv_default_loop();
  rmdir("test_dir");
  iVar2 = uv_fs_mkdir(loop,&mkdir_req,"test_dir",0x1ed,mkdir_cb);
  if (iVar2 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdir_cb_count != 1) goto LAB_001568e1;
    iVar2 = uv_fs_open(loop,&open_req1,"test_dir",0x10000,0x180,(uv_fs_cb)0x0);
    if (iVar2 < 0) goto LAB_001568e6;
    uv_fs_req_cleanup(&open_req1);
    uVar15 = uv_buf_init(acStack_a62,2);
    iov = uVar15;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,&read_req,(uv_file)open_req1.result,&iov,1,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x15) goto LAB_001568eb;
    uv_fs_req_cleanup(&read_req);
    iVar2 = uv_fs_close((uv_loop_t *)0x0,&close_req,(uv_file)open_req1.result,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      uv_fs_req_cleanup(&close_req);
      rmdir("test_dir");
      puVar5 = uv_default_loop();
      uv_walk(puVar5,close_walk_cb,(void *)0x0);
      uv_run(puVar5,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar2 = uv_loop_close(puVar5);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_001568f5;
    }
  }
  else {
    run_test_fs_read_dir_cold_1();
LAB_001568e1:
    run_test_fs_read_dir_cold_2();
LAB_001568e6:
    run_test_fs_read_dir_cold_3();
LAB_001568eb:
    run_test_fs_read_dir_cold_4();
  }
  run_test_fs_read_dir_cold_5();
LAB_001568f5:
  run_test_fs_read_dir_cold_6();
  test_fs_partial(1);
  return 0;
}

Assistant:

TEST_IMPL(fs_scandir_empty_dir) {
  const char* path;
  uv_fs_t req;
  uv_dirent_t dent;
  int r;

  path = "./empty_dir/";
  loop = uv_default_loop();

  uv_fs_mkdir(NULL, &req, path, 0777, NULL);
  uv_fs_req_cleanup(&req);

  /* Fill the req to ensure that required fields are cleaned up */
  memset(&req, 0xdb, sizeof(req));

  r = uv_fs_scandir(NULL, &req, path, 0, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  ASSERT(req.ptr == NULL);
  ASSERT(UV_EOF == uv_fs_scandir_next(&req, &dent));
  uv_fs_req_cleanup(&req);

  r = uv_fs_scandir(loop, &scandir_req, path, 0, empty_scandir_cb);
  ASSERT(r == 0);

  ASSERT(scandir_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(scandir_cb_count == 1);

  uv_fs_rmdir(NULL, &req, path, NULL);
  uv_fs_req_cleanup(&req);

  MAKE_VALGRIND_HAPPY();
  return 0;
}